

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error ft_gzip_file_skip_output(FT_GZipFile zip,FT_ULong count)

{
  ulong local_28;
  FT_ULong delta;
  FT_ULong FStack_18;
  FT_Error error;
  FT_ULong count_local;
  FT_GZipFile zip_local;
  
  delta._4_4_ = 0;
  FStack_18 = count;
  do {
    local_28 = (long)zip->limit - (long)zip->cursor;
    if (FStack_18 <= local_28) {
      local_28 = FStack_18;
    }
    zip->cursor = zip->cursor + local_28;
    zip->pos = local_28 + zip->pos;
    FStack_18 = FStack_18 - local_28;
  } while ((FStack_18 != 0) && (delta._4_4_ = ft_gzip_file_fill_output(zip), delta._4_4_ == 0));
  return delta._4_4_;
}

Assistant:

static FT_Error
  ft_gzip_file_skip_output( FT_GZipFile  zip,
                            FT_ULong     count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  delta;


    for (;;)
    {
      delta = (FT_ULong)( zip->limit - zip->cursor );
      if ( delta >= count )
        delta = count;

      zip->cursor += delta;
      zip->pos    += delta;

      count -= delta;
      if ( count == 0 )
        break;

      error = ft_gzip_file_fill_output( zip );
      if ( error )
        break;
    }

    return error;
  }